

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtp_write_body_junk(Curl_easy *data,char *buf,size_t blen)

{
  bool bVar1;
  rtsp_conn *local_48;
  _Bool in_body;
  curl_off_t body_remain;
  rtsp_conn *rtspc;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  bVar1 = false;
  if ((((data->req).headerline != 0) &&
      (bVar1 = false, (*(byte *)((long)&data->conn->proto + 0x34) & 1) == 0)) &&
     (bVar1 = false, -1 < (data->req).size)) {
    bVar1 = (data->req).bytecount < (data->req).size;
  }
  if (bVar1) {
    local_48 = (rtsp_conn *)((data->req).size - (data->req).bytecount);
  }
  else {
    local_48 = (rtsp_conn *)0x0;
  }
  if (local_48 == (rtsp_conn *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    rtspc = (rtsp_conn *)blen;
    if ((long)local_48 < (long)blen) {
      rtspc = local_48;
    }
    data_local._4_4_ = Curl_client_write(data,1,buf,(size_t)rtspc);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode rtp_write_body_junk(struct Curl_easy *data,
                                    const char *buf,
                                    size_t blen)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  curl_off_t body_remain;
  bool in_body;

  in_body = (data->req.headerline && !rtspc->in_header) &&
            (data->req.size >= 0) &&
            (data->req.bytecount < data->req.size);
  body_remain = in_body ? (data->req.size - data->req.bytecount) : 0;
  DEBUGASSERT(body_remain >= 0);
  if(body_remain) {
    if((curl_off_t)blen > body_remain)
      blen = (size_t)body_remain;
    return Curl_client_write(data, CLIENTWRITE_BODY, buf, blen);
  }
  return CURLE_OK;
}